

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadWriteUnittest.cpp
# Opt level: O2

void __thiscall ReadWriteUnittest::FillFields(ReadWriteUnittest *this)

{
  pointer piVar1;
  pointer pdVar2;
  pointer pfVar3;
  ulong uVar4;
  int iVar5;
  int i;
  int iVar6;
  int k;
  int iVar7;
  int k_1;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  
  iVar12 = this->iSize;
  iVar5 = 0;
  for (iVar6 = 0; iVar6 < iVar12; iVar6 = iVar6 + 1) {
    iVar9 = this->jSize;
    iVar11 = iVar6;
    for (iVar8 = 0; iVar8 < iVar9; iVar8 = iVar8 + 1) {
      piVar1 = (this->fieldInt3).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (this->fieldDouble3).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar3 = (this->fieldFloat3).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar13 = iVar11;
      for (iVar7 = 0; iVar7 < this->kSize; iVar7 = iVar7 + 1) {
        piVar1[(iVar9 * iVar7 + iVar8) * iVar12 + iVar6] = iVar13;
        iVar12 = this->iSize;
        iVar9 = this->jSize;
        iVar14 = (iVar9 * iVar7 + iVar8) * iVar12 + iVar6;
        pdVar2[iVar14] =
             (double)iVar7 * -12.5 * (double)iVar6 + (double)iVar6 * 1.125 + (double)iVar8 * 2.25;
        pfVar3[iVar14] =
             (float)iVar7 * -16.0 * (float)iVar6 + (float)iVar6 * 1.5 + (float)iVar8 * 4.25;
        iVar13 = iVar13 + iVar5;
      }
      iVar11 = iVar11 + 2;
    }
    iVar5 = iVar5 + -0xc;
  }
  iVar5 = 0;
  for (iVar6 = 0; iVar6 < iVar12; iVar6 = iVar6 + 1) {
    piVar1 = (this->fieldInt2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar12 = iVar6;
    for (iVar9 = 0; iVar9 < this->kSize; iVar9 = iVar9 + 1) {
      piVar1[this->iSize * iVar9 + iVar6] = iVar12;
      iVar12 = iVar12 + iVar5;
    }
    iVar12 = this->iSize;
    iVar5 = iVar5 + -0xc;
  }
  pdVar2 = (this->fieldDouble1).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar3 = (this->fieldFloat1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = 0;
  uVar4 = (ulong)(uint)this->jSize;
  if (this->jSize < 1) {
    uVar4 = uVar10;
  }
  for (; uVar4 != uVar10; uVar10 = uVar10 + 1) {
    iVar12 = (int)uVar10 * (int)uVar10;
    pdVar2[uVar10] = (double)iVar12 + 2.875;
    pfVar3[uVar10] = (float)iVar12 + 3.5;
  }
  return;
}

Assistant:

void FillFields() {
        for (int i = 0; i < iSize; ++i)
            for (int j = 0; j < jSize; ++j)
                for (int k = 0; k < kSize; ++k)
                {
                    fieldInt3[i + j*iSize + k*iSize*jSize] = i + 2*j - 12*k*i;
                    fieldDouble3[i + j*iSize + k*iSize*jSize] = 1.125*i + 2.25*j - 12.5*k*i;
                    fieldFloat3[i + j*iSize + k*iSize*jSize] = 1.5f*i + 4.25f*j - 16.0f*k*i;
                }

        for (int i = 0; i < iSize; ++i)
            for (int k = 0; k < kSize; ++k)
            {
                fieldInt2[i + k*iSize] = i - 12*k*i;
            }

        for (int j = 0; j < jSize; ++j)
        {
            fieldDouble1[j] = j*j+2.875;
            fieldFloat1[j] = j*j+3.5f;
        }
    }